

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

Time __thiscall L11_1::Time::operator+(Time *this,Time *t)

{
  int iVar1;
  Time TVar2;
  
  iVar1 = this->minute % 0x3c + t->minute;
  TVar2.hour = iVar1 / 0x3c + this->minute / 0x3c + this->hour + t->hour;
  TVar2.minute = iVar1 % 0x3c;
  return TVar2;
}

Assistant:

Time Time::sum(const Time &t) const {
    //  局部变量存储 sum
    Time total;
    total.reset(hour, minute);
    total.addHour(t.hour);
    total.addMin(t.minute);
    //  实际上返回了该局部变量的拷贝供函数外使用，原本局部变量被删除
    return total;
}